

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void rollback_without_seqtree(bool multi_kv)

{
  void *pvVar1;
  fdb_doc *doc;
  fdb_status fVar2;
  int iVar3;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  char *pcVar4;
  long lVar5;
  fdb_kvs_handle **ptr_handle;
  undefined7 in_register_00000039;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_snapshot_info_t *markers;
  int local_4d8;
  uint local_4d4;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *local_4c8 [3];
  uint64_t num_markers;
  fdb_kvs_config kvs_config;
  char kv_name [8];
  timeval __test_begin;
  fdb_doc *local_478 [10];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.flags = 1;
  fconfig.block_reusing_threshold = 0;
  fconfig.seqtree_opt = '\0';
  fconfig.multi_kv_instances = multi_kv;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  local_4d8 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_4d8 == 0) {
    fdb_kvs_open_default(dbfile,local_4c8,&kvs_config);
    lVar5 = 1;
  }
  else {
    ptr_handle = local_4c8;
    lVar5 = 3;
    for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
      sprintf(kv_name,"kv%d",uVar6 & 0xffffffff);
      fdb_kvs_open(dbfile,ptr_handle,kv_name,&kvs_config);
      ptr_handle = ptr_handle + 1;
    }
  }
  for (uVar7 = 0; uVar7 != 5; uVar7 = uVar7 + 1) {
    local_4d4 = uVar7;
    for (uVar6 = 0; uVar7 = local_4d4, uVar6 != 10; uVar6 = uVar6 + 1) {
      sprintf(keybuf,"key%d",uVar6 & 0xffffffff);
      sprintf(metabuf,"meta-%d-%d",(ulong)uVar7,uVar6 & 0xffffffff);
      sprintf(bodybuf,"body-%d-%d",(ulong)uVar7,uVar6 & 0xffffffff);
      keylen = strlen(keybuf);
      metalen = strlen(metabuf);
      bodylen = strlen(bodybuf);
      fdb_doc_create(local_478 + uVar6,keybuf,keylen,metabuf,metalen,bodybuf,bodylen);
      for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
        fdb_set(local_4c8[lVar8],local_478[uVar6]);
      }
      fdb_doc_free(local_478[uVar6]);
    }
    fdb_commit(dbfile,~(byte)local_4d4 & 1);
  }
  fVar2 = fdb_get_all_snap_markers(dbfile,&markers,&num_markers);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x148d);
    rollback_without_seqtree(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x148d,"void rollback_without_seqtree(bool)");
  }
  fVar2 = fdb_rollback(local_4c8,(markers[3].kvs_markers)->seqnum);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1491);
    rollback_without_seqtree(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1491,"void rollback_without_seqtree(bool)");
  }
  rdoc = (fdb_doc *)0x0;
  lVar8 = 0;
  do {
    if (lVar8 == lVar5) {
      lVar8 = 0;
      while (lVar5 != lVar8) {
        fVar2 = fdb_kvs_close(local_4c8[lVar8]);
        lVar8 = lVar8 + 1;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x14bd);
          rollback_without_seqtree(bool)::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x14bd,"void rollback_without_seqtree(bool)");
        }
      }
      fVar2 = fdb_rollback_all(dbfile,markers[3].marker);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14c1);
        rollback_without_seqtree(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14c1,"void rollback_without_seqtree(bool)");
      }
      fVar2 = fdb_free_snap_markers(markers,num_markers);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_close(dbfile);
        fdb_shutdown();
        memleak_end();
        pcVar4 = "single kv mode:";
        if ((char)local_4d8 != '\0') {
          pcVar4 = "multiple kv mode:";
        }
        sprintf(bodybuf,"rollback without seqtree in %s",pcVar4);
        pcVar4 = "%s PASSED\n";
        if (rollback_without_seqtree(bool)::__test_pass != '\0') {
          pcVar4 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar4,bodybuf);
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x14c4);
      rollback_without_seqtree(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x14c4,"void rollback_without_seqtree(bool)");
    }
    fVar2 = fdb_snapshot_open(local_4c8[lVar8],&snap_db,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1499);
      rollback_without_seqtree(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1499,"void rollback_without_seqtree(bool)");
    }
    fVar2 = fdb_iterator_init(snap_db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x149d);
      rollback_without_seqtree(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x149d,"void rollback_without_seqtree(bool)");
    }
    uVar7 = 0;
    do {
      fVar2 = fdb_iterator_get(iterator,&rdoc);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14a1);
        rollback_without_seqtree(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14a1,"void rollback_without_seqtree(bool)");
      }
      sprintf(keybuf,"key%d",(ulong)uVar7);
      if (lVar8 == 0) {
        sprintf(metabuf,"meta-1-%d",(ulong)uVar7);
        sprintf(bodybuf,"body-1-%d",(ulong)uVar7);
      }
      else {
        sprintf(metabuf,"meta-%d-%d",4,(ulong)uVar7);
        sprintf(bodybuf,"body-%d-%d",4);
      }
      doc = rdoc;
      pvVar1 = rdoc->key;
      iVar3 = bcmp(pvVar1,keybuf,rdoc->keylen);
      if (iVar3 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",keybuf,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14ab);
        rollback_without_seqtree(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14ab,"void rollback_without_seqtree(bool)");
      }
      pvVar1 = doc->meta;
      iVar3 = bcmp(pvVar1,metabuf,doc->metalen);
      if (iVar3 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",metabuf,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14ac);
        rollback_without_seqtree(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14ac,"void rollback_without_seqtree(bool)");
      }
      pvVar1 = doc->body;
      iVar3 = bcmp(pvVar1,bodybuf,doc->bodylen);
      if (iVar3 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14ad);
        rollback_without_seqtree(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14ad,"void rollback_without_seqtree(bool)");
      }
      fdb_doc_free(doc);
      rdoc = (fdb_doc *)0x0;
      uVar7 = uVar7 + 1;
      fVar2 = fdb_iterator_next(iterator);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar7 != 10) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x14b2);
      rollback_without_seqtree(bool)::__test_pass = 1;
      __assert_fail("i==n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x14b2,"void rollback_without_seqtree(bool)");
    }
    fVar2 = fdb_iterator_close(iterator);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x14b4);
      rollback_without_seqtree(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x14b4,"void rollback_without_seqtree(bool)");
    }
    fVar2 = fdb_kvs_close(snap_db);
    lVar8 = lVar8 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x14b7);
      rollback_without_seqtree(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x14b7,"void rollback_without_seqtree(bool)");
    }
  } while( true );
}

Assistant:

void rollback_without_seqtree(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 10;
    int num_commits = 5, num_kvs = 3;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    uint64_t num_markers;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.multi_kv_instances = multi_kv;
    // for creating the strict number of snapshots, disable block reusing
    fconfig.block_reusing_threshold = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_NOT_USE;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    // Load documents mulitple times
    for (j=0; j < num_commits; ++j) {
        for (i=0; i<n; i++){
            sprintf(keybuf, "key%d", i);
            sprintf(metabuf, "meta-%d-%d", j, i);
            sprintf(bodybuf, "body-%d-%d", j, i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                           (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            for (r = 0; r < num_kvs; ++r) {
                fdb_set(db[r], doc[i]);
            }
            fdb_doc_free(doc[i]);
        }
        if (j % 2 == 0) {
            fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        } else {
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        }
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Rollback the first KV store to the second commit point
    status = fdb_rollback(&db[0], markers[3].kvs_markers[0].seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_handle *snap_db;
    fdb_iterator *iterator;
    fdb_doc *rdoc = NULL;
    // Create an in-memory snapshot for each KV store and verify all the keys.
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_snapshot_open(db[r], &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Verify all the keys in the snapshot
        status = fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        i=0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(keybuf, "key%d", i);
            if (r == 0) {
                // The first KV store should only have KV items from the second commit.
                sprintf(metabuf, "meta-1-%d", i);
                sprintf(bodybuf, "body-1-%d", i);
            } else {
                sprintf(metabuf, "meta-%d-%d", num_commits - 1, i);
                sprintf(bodybuf, "body-%d-%d", num_commits - 1, i);
            }
            TEST_CMP(rdoc->key, keybuf, rdoc->keylen);
            TEST_CMP(rdoc->meta, metabuf, rdoc->metalen);
            TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
            fdb_doc_free(rdoc);
            rdoc = NULL;
            i++;
        } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        TEST_CHK(i==n);
        status = fdb_iterator_close(iterator);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_kvs_close(snap_db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // Close all the KV store handles
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_kvs_close(db[r]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Rollback all the KV stores to the second commit point
    status = fdb_rollback_all(dbfile, markers[3].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback without seqtree in %s",
            multi_kv ? "multiple kv mode:" : "single kv mode:");
    TEST_RESULT(bodybuf);
}